

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.cpp
# Opt level: O0

void __thiscall phaeton::Stmt::dump(Stmt *this,uint Indent)

{
  Identifier *this_00;
  Expression *pEVar1;
  undefined4 uVar2;
  int iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  string local_1f8 [48];
  stringstream local_1c8 [8];
  stringstream StrStream;
  ostream local_1b8 [380];
  ASTNodeKind local_3c;
  string local_38 [8];
  string Str;
  uint Indent_local;
  Stmt *this_local;
  
  Str.field_2._12_4_ = Indent;
  local_3c = ASTNode::getASTNodeKind(&this->super_ASTNode);
  pmVar4 = std::
           map<phaeton::ASTNode::ASTNodeKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<phaeton::ASTNode::ASTNodeKind>,_std::allocator<std::pair<const_phaeton::ASTNode::ASTNodeKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&ASTNode::NodeLabel_abi_cxx11_,&local_3c);
  std::__cxx11::string::string(local_38,(string *)pmVar4);
  std::__cxx11::stringstream::stringstream(local_1c8);
  poVar5 = std::operator<<(local_1b8," <");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::hex);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this);
  std::operator<<(poVar5,">");
  std::ios_base::width
            ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),
             (ulong)(uint)Str.field_2._12_4_);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
  std::operator<<(poVar5,"");
  std::ios_base::unsetf
            ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),_S_adjustfield);
  poVar5 = std::operator<<((ostream *)&std::cout,"(");
  poVar5 = std::operator<<(poVar5,local_38);
  std::__cxx11::stringstream::str();
  poVar5 = std::operator<<(poVar5,local_1f8);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string(local_1f8);
  uVar2 = Str.field_2._12_4_;
  this_00 = this->Id;
  iVar3 = std::__cxx11::string::length();
  Identifier::dump(this_00,uVar2 + 1 + iVar3);
  uVar2 = Str.field_2._12_4_;
  pEVar1 = this->RightExpr;
  iVar3 = std::__cxx11::string::length();
  (*(pEVar1->super_ASTNode)._vptr_ASTNode[1])(pEVar1,(ulong)(uint)(uVar2 + 1 + iVar3));
  std::ios_base::width
            ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),
             (ulong)(Str.field_2._12_4_ + 1));
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
  std::operator<<(poVar5,"");
  std::ios_base::unsetf
            ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),_S_adjustfield);
  std::operator<<((ostream *)&std::cout,")\n");
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Stmt::dump(unsigned Indent) const {
  std::string Str = NodeLabel[getASTNodeKind()];

  std::stringstream StrStream;
  StrStream << " <" << std::hex << this << ">";

  FORMAT_AST_INDENT(Indent)
  std::cout << "(" << Str << StrStream.str() << "\n";
  Id->dump(Indent + Str.length() + 1);
  RightExpr->dump(Indent + Str.length() + 1);
  FORMAT_AST_INDENT(Indent + 1)
  std::cout << ")\n";
}